

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O0

int Index(int ndim,int *subscript,int *dims)

{
  int factor;
  int i;
  int idx;
  int *dims_local;
  int *subscript_local;
  int ndim_local;
  
  idx = 0;
  factor = 1;
  for (i = 0; i < ndim; i = i + 1) {
    idx = subscript[i] * factor + idx;
    factor = dims[i] * factor;
  }
  return idx;
}

Assistant:

int Index(int ndim, int subscript[], int dims[])
{
    int idx = 0, i, factor=1;
    for(i=0;i<ndim;i++){
        idx += subscript[i]*factor;
        factor *= dims[i];
    }
    return idx;
}